

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

void Vta_ManCollectNodes_rec(Vta_Man_t *p,Vta_Obj_t *pThis,Vec_Int_t *vOrder)

{
  Gia_Obj_t *p_00;
  int Entry;
  Vta_Obj_t *local_38;
  Vta_Obj_t *pThis1;
  Vta_Obj_t *pThis0;
  Gia_Obj_t *pObj;
  Vec_Int_t *vOrder_local;
  Vta_Obj_t *pThis_local;
  Vta_Man_t *p_local;
  
  if (-1 < *(int *)&pThis->field_0xc) {
    *(uint *)&pThis->field_0xc = *(uint *)&pThis->field_0xc & 0x7fffffff | 0x80000000;
    pObj = (Gia_Obj_t *)vOrder;
    vOrder_local = (Vec_Int_t *)pThis;
    pThis_local = (Vta_Obj_t *)p;
    pThis0 = (Vta_Obj_t *)Gia_ManObj(p->pGia,pThis->iObj);
    if ((*(uint *)((long)&vOrder_local->pArray + 4) >> 0x1e & 1) != 0) {
      Vta_ObjPreds((Vta_Man_t *)pThis_local,(Vta_Obj_t *)vOrder_local,(Gia_Obj_t *)pThis0,&pThis1,
                   &local_38);
      if (pThis1 != (Vta_Obj_t *)0x0) {
        Vta_ManCollectNodes_rec((Vta_Man_t *)pThis_local,pThis1,(Vec_Int_t *)pObj);
      }
      if (local_38 != (Vta_Obj_t *)0x0) {
        Vta_ManCollectNodes_rec((Vta_Man_t *)pThis_local,local_38,(Vec_Int_t *)pObj);
      }
    }
    p_00 = pObj;
    Entry = Vta_ObjId((Vta_Man_t *)pThis_local,(Vta_Obj_t *)vOrder_local);
    Vec_IntPush((Vec_Int_t *)p_00,Entry);
  }
  return;
}

Assistant:

void Vta_ManCollectNodes_rec( Vta_Man_t * p, Vta_Obj_t * pThis, Vec_Int_t * vOrder )
{
    Gia_Obj_t * pObj;
    Vta_Obj_t * pThis0, * pThis1;
    if ( pThis->fVisit )
        return;
    pThis->fVisit = 1;
    pObj = Gia_ManObj( p->pGia, pThis->iObj );
    if ( pThis->fAdded )
    {
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        if ( pThis0 ) Vta_ManCollectNodes_rec( p, pThis0, vOrder );
        if ( pThis1 ) Vta_ManCollectNodes_rec( p, pThis1, vOrder );
    }
    Vec_IntPush( vOrder, Vta_ObjId(p, pThis) );
}